

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pExpr,Fts5Colset *pColset)

{
  char *pcVar1;
  Fts5Colset *local_28;
  Fts5Colset *pFree;
  Fts5Colset *pColset_local;
  Fts5ExprNode *pExpr_local;
  Fts5Parse *pParse_local;
  
  local_28 = pColset;
  pFree = pColset;
  pColset_local = (Fts5Colset *)pExpr;
  pExpr_local = (Fts5ExprNode *)pParse;
  if (pParse->pConfig->eDetail == 1) {
    pParse->rc = 1;
    pcVar1 = sqlite3_mprintf("fts5: column queries are not supported (detail=none)");
    *(char **)&pExpr_local->bNomatch = pcVar1;
  }
  else {
    fts5ParseSetColset(pParse,pExpr,pColset,&local_28);
  }
  sqlite3_free(local_28);
  return;
}

Assistant:

static void sqlite3Fts5ParseSetColset(
  Fts5Parse *pParse, 
  Fts5ExprNode *pExpr, 
  Fts5Colset *pColset 
){
  Fts5Colset *pFree = pColset;
  if( pParse->pConfig->eDetail==FTS5_DETAIL_NONE ){
    pParse->rc = SQLITE_ERROR;
    pParse->zErr = sqlite3_mprintf(
      "fts5: column queries are not supported (detail=none)"
    );
  }else{
    fts5ParseSetColset(pParse, pExpr, pColset, &pFree);
  }
  sqlite3_free(pFree);
}